

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbinaryast.cpp
# Opt level: O2

int8_t __thiscall InputStream::readInt8(InputStream *this)

{
  int iVar1;
  
  iVar1 = (**this->_vptr_InputStream)();
  return (int8_t)iVar1;
}

Assistant:

int8_t InputStream::readInt8() {

  union {
    int8_t i;
    uint8_t u;
  } conv;

  conv.u = readByte();
  return conv.i;
}